

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

void __thiscall libtorrent::dht::dht_tracker::new_socket(dht_tracker *this,listen_socket_handle *s)

{
  io_context *__args;
  session_settings *__args_3;
  counters *__args_6;
  dht_observer *pdVar1;
  unsigned_long __args_1;
  bool bVar2;
  uint uVar3;
  iterator __first;
  iterator __last;
  pointer ppVar4;
  undefined8 uVar5;
  node_id *c;
  undefined8 uVar6;
  pointer ppVar7;
  pointer __args_1_00;
  tuple<boost::asio::io_context_&,_const_libtorrent::aux::listen_socket_handle_&,_libtorrent::dht::dht_tracker_*&&,_const_libtorrent::aux::session_settings_&,_const_libtorrent::digest32<160L>_&,_libtorrent::dht::dht_observer_*&,_libtorrent::counters_&,_std::_Bind<libtorrent::dht::node_*(libtorrent::dht::dht_tracker::*(libtorrent::dht::dht_tracker_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::digest32<160L>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>_&&,_libtorrent::dht::dht_storage_interface_&>
  *__return_storage_ptr__;
  pair<std::_Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>,_bool>
  pVar8;
  span<const_char> in;
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  local_248;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  local_228;
  undefined1 local_210 [84];
  int local_1bc;
  duration<long,std::ratio<1l,1l>> local_1b8 [8];
  duration<long,std::ratio<1l,1000000000l>> local_1b0 [24];
  pointer local_198;
  pointer local_190;
  string local_188;
  string local_168;
  _Base_ptr local_148;
  undefined1 local_140;
  dht_tracker *local_138;
  code *local_130 [2];
  type local_120;
  dht_tracker *local_108;
  tuple<boost::asio::io_context_&,_const_libtorrent::aux::listen_socket_handle_&,_libtorrent::dht::dht_tracker_*&&,_const_libtorrent::aux::session_settings_&,_const_libtorrent::digest32<160L>_&,_libtorrent::dht::dht_observer_*&,_libtorrent::counters_&,_std::_Bind<libtorrent::dht::node_*(libtorrent::dht::dht_tracker::*(libtorrent::dht::dht_tracker_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::digest32<160L>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>_&&,_libtorrent::dht::dht_storage_interface_&>
  local_100;
  undefined1 local_b8 [16];
  _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
  local_a8;
  pair<std::_Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>,_bool>
  n;
  undefined1 local_8c [8];
  node_id nid;
  __normal_iterator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_*,_std::vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>_>
  local_60;
  __normal_iterator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_*,_std::vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>_>
  stored_nid;
  undefined1 local_38 [8];
  address local_address;
  listen_socket_handle *s_local;
  dht_tracker *this_local;
  
  local_address.ipv6_address_.scope_id_ = (unsigned_long)s;
  libtorrent::aux::listen_socket_handle::get_local_endpoint
            ((endpoint *)((long)&stored_nid._M_current + 4),s);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
            ((address *)local_38,
             (basic_endpoint<boost::asio::ip::tcp> *)((long)&stored_nid._M_current + 4));
  __first = ::std::
            vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
            ::begin(&(this->m_state).nids);
  __last = ::std::
           vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
           ::end(&(this->m_state).nids);
  nid.m_number._M_elems._12_8_ = local_38;
  local_60 = ::std::
             find_if<__gnu_cxx::__normal_iterator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>*,std::vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>>,libtorrent::dht::dht_tracker::new_socket(libtorrent::aux::listen_socket_handle_const&)::__0>
                       (__first._M_current,__last._M_current,
                        (anon_class_8_1_df97e540_for__M_pred)nid.m_number._M_elems._12_8_);
  n._8_8_ = ::std::
            vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
            ::end(&(this->m_state).nids);
  bVar2 = __gnu_cxx::operator!=
                    (&local_60,
                     (__normal_iterator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_*,_std::vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>_>
                      *)&n.second);
  if (bVar2) {
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_*,_std::vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>_>
             ::operator->(&local_60);
    local_8c = *(undefined1 (*) [8])(ppVar4->second).m_number._M_elems;
    nid.m_number._M_elems._0_8_ = *(undefined8 *)((ppVar4->second).m_number._M_elems + 2);
    nid.m_number._M_elems[2] = (ppVar4->second).m_number._M_elems[4];
  }
  else {
    digest32<160L>::digest32((digest32<160L> *)local_8c);
  }
  ::std::forward_as_tuple<libtorrent::aux::listen_socket_handle_const&>
            ((listen_socket_handle *)local_b8);
  __args_1 = local_address.ipv6_address_.scope_id_;
  __args = this->m_ioc;
  __args_3 = this->m_settings;
  __args_6 = this->m_counters;
  local_130[0] = get_node;
  local_130[1] = (code *)0x0;
  local_138 = this;
  local_108 = this;
  ::std::
  bind<libtorrent::dht::node*(libtorrent::dht::dht_tracker::*)(libtorrent::digest32<160l>const&,std::basic_string_view<char,std::char_traits<char>>),libtorrent::dht::dht_tracker*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_120,(offset_in_dht_tracker_to_subr *)local_130,&local_138,
             (_Placeholder<1> *)&::std::placeholders::_1,(_Placeholder<2> *)&::std::placeholders::_2
            );
  __return_storage_ptr__ = &local_100;
  ::std::
  forward_as_tuple<boost::asio::io_context&,libtorrent::aux::listen_socket_handle_const&,libtorrent::dht::dht_tracker*,libtorrent::aux::session_settings_const&,libtorrent::digest32<160l>const&,libtorrent::dht::dht_observer*&,libtorrent::counters&,std::_Bind<libtorrent::dht::node*(libtorrent::dht::dht_tracker::*(libtorrent::dht::dht_tracker*,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::digest32<160l>const&,std::basic_string_view<char,std::char_traits<char>>)>,libtorrent::dht::dht_storage_interface&>
            (__return_storage_ptr__,__args,(listen_socket_handle *)__args_1,&local_108,__args_3,
             (digest32<160L> *)local_8c,&this->m_log,__args_6,&local_120,this->m_storage);
  pVar8 = ::std::
          map<libtorrent::aux::listen_socket_handle,libtorrent::dht::dht_tracker::tracker_node,std::less<libtorrent::aux::listen_socket_handle>,std::allocator<std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>>>
          ::
          emplace<std::piecewise_construct_t,std::tuple<libtorrent::aux::listen_socket_handle_const&>,std::tuple<boost::asio::io_context&,libtorrent::aux::listen_socket_handle_const&,libtorrent::dht::dht_tracker*&&,libtorrent::aux::session_settings_const&,libtorrent::digest32<160l>const&,libtorrent::dht::dht_observer*&,libtorrent::counters&,std::_Bind<libtorrent::dht::node*(libtorrent::dht::dht_tracker::*(libtorrent::dht::dht_tracker*,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::digest32<160l>const&,std::basic_string_view<char,std::char_traits<char>>)>&&,libtorrent::dht::dht_storage_interface&>>
                    ((map<libtorrent::aux::listen_socket_handle,libtorrent::dht::dht_tracker::tracker_node,std::less<libtorrent::aux::listen_socket_handle>,std::allocator<std::pair<libtorrent::aux::listen_socket_handle_const,libtorrent::dht::dht_tracker::tracker_node>>>
                      *)&this->m_nodes,(piecewise_construct_t *)(local_b8 + 0xf),
                     (tuple<const_libtorrent::aux::listen_socket_handle_&> *)local_b8,
                     __return_storage_ptr__);
  local_148 = (_Base_ptr)pVar8.first._M_node;
  local_140 = pVar8.second;
  local_a8._M_node = local_148;
  n.first._M_node._0_1_ = local_140;
  update_storage_node_ids(this);
  uVar3 = (**(this->m_log->super_dht_logger)._vptr_dht_logger)(this->m_log,0);
  if ((uVar3 & 1) != 0) {
    pdVar1 = this->m_log;
    boost::asio::ip::address::to_string_abi_cxx11_(&local_168,(address *)local_38);
    uVar5 = ::std::__cxx11::string::c_str();
    ppVar7 = ::std::
             _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
             ::operator->(&local_a8);
    c = dht::node::nid(&(ppVar7->second).dht);
    span<char_const>::span<libtorrent::digest32<160l>,char,void>((span<char_const> *)&local_198,c);
    in.m_len = (difference_type)__return_storage_ptr__;
    in.m_ptr = (char *)local_190;
    libtorrent::aux::to_hex_abi_cxx11_(&local_188,(aux *)local_198,in);
    uVar6 = ::std::__cxx11::string::c_str();
    (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
              (pdVar1,0,"starting %s DHT tracker with node id: %s",uVar5,uVar6);
    ::std::__cxx11::string::~string((string *)&local_188);
    ::std::__cxx11::string::~string((string *)&local_168);
  }
  if (((this->m_running & 1U) != 0) && (((byte)n.first._M_node & 1) != 0)) {
    ppVar7 = ::std::
             _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
             ::operator->(&local_a8);
    local_1bc = 1;
    ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_1b8,&local_1bc);
    ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              (local_1b0,(duration<long,_std::ratio<1L,_1L>_> *)local_1b8);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::expires_after(&(ppVar7->second).connection_timer,(duration *)local_1b0);
    ppVar7 = ::std::
             _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
             ::operator->(&local_a8);
    local_210._16_8_ = connection_timeout;
    local_210._24_8_ = (pointer)0x0;
    self((dht_tracker *)local_210);
    __args_1_00 = ::std::
                  _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
                  ::operator->(&local_a8);
    ::std::
    bind<void(libtorrent::dht::dht_tracker::*)(libtorrent::aux::listen_socket_handle_const&,boost::system::error_code_const&),std::shared_ptr<libtorrent::dht::dht_tracker>,libtorrent::aux::listen_socket_handle_const&,std::_Placeholder<1>const&>
              ((type *)(local_210 + 0x20),(offset_in_dht_tracker_to_subr *)(local_210 + 0x10),
               (shared_ptr<libtorrent::dht::dht_tracker> *)local_210,&__args_1_00->first,
               (_Placeholder<1> *)&::std::placeholders::_1);
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_wait<std::_Bind<void(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,libtorrent::aux::listen_socket_handle,std::_Placeholder<1>))(libtorrent::aux::listen_socket_handle_const&,boost::system::error_code_const&)>>
              ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)&(ppVar7->second).connection_timer,
               (_Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>))(const_libtorrent::aux::listen_socket_handle_&,_const_boost::system::error_code_&)>
                *)(local_210 + 0x20));
    ::std::
    _Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>))(const_libtorrent::aux::listen_socket_handle_&,_const_boost::system::error_code_&)>
    ::~_Bind((_Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_libtorrent::aux::listen_socket_handle,_std::_Placeholder<1>))(const_libtorrent::aux::listen_socket_handle_&,_const_boost::system::error_code_&)>
              *)(local_210 + 0x20));
    ::std::shared_ptr<libtorrent::dht::dht_tracker>::~shared_ptr
              ((shared_ptr<libtorrent::dht::dht_tracker> *)local_210);
    ppVar7 = ::std::
             _Rb_tree_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
             ::operator->(&local_a8);
    local_228.
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ::vector(&local_228);
    ::std::
    function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
    ::function(&local_248);
    dht::node::bootstrap(&(ppVar7->second).dht,&local_228,&local_248);
    ::std::
    function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
    ::~function(&local_248);
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ::~vector(&local_228);
  }
  return;
}

Assistant:

void dht_tracker::new_socket(aux::listen_socket_handle const& s)
	{
		address const local_address = s.get_local_endpoint().address();
		auto stored_nid = std::find_if(m_state.nids.begin(), m_state.nids.end()
			, [&](node_ids_t::value_type const& nid) { return nid.first == local_address; });
		node_id const nid = stored_nid != m_state.nids.end() ? stored_nid->second : node_id();
		// must use piecewise construction because tracker_node::connection_timer
		// is neither copyable nor movable
		auto n = m_nodes.emplace(std::piecewise_construct_t(), std::forward_as_tuple(s)
			, std::forward_as_tuple(m_ioc
			, s, this, m_settings, nid, m_log, m_counters
			, std::bind(&dht_tracker::get_node, this, _1, _2)
			, m_storage));

		update_storage_node_ids();

#ifndef TORRENT_DISABLE_LOGGING
		if (m_log->should_log(dht_logger::tracker))
		{
			m_log->log(dht_logger::tracker, "starting %s DHT tracker with node id: %s"
				, local_address.to_string().c_str()
				, aux::to_hex(n.first->second.dht.nid()).c_str());
		}
#endif

		if (m_running && n.second)
		{
			ADD_OUTSTANDING_ASYNC("dht_tracker::connection_timeout");
			n.first->second.connection_timer.expires_after(seconds(1));
			n.first->second.connection_timer.async_wait(
				std::bind(&dht_tracker::connection_timeout, self(), n.first->first, _1));
			n.first->second.dht.bootstrap({}, find_data::nodes_callback());
		}
	}